

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O0

string * __thiscall
cfd::api::ElementsTransactionApi::CreateSignatureHash
          (ElementsTransactionApi *this,string *tx_hex,ConfidentialTxInReference *txin,
          ByteData *key_data,ConfidentialValue *value,HashType hash_type,SigHashType *sighash_type)

{
  AbstractTxInReference *in_RCX;
  string *in_RDI;
  ByteData *in_stack_00000128;
  uint32_t in_stack_00000134;
  Txid *in_stack_00000138;
  string *in_stack_00000140;
  ElementsTransactionApi *in_stack_00000148;
  ConfidentialValue *in_stack_00000160;
  HashType in_stack_00000168;
  SigHashType *in_stack_00000170;
  AbstractTxInReference *in_stack_ffffffffffffff68;
  
  core::AbstractTxInReference::GetTxid(in_stack_ffffffffffffff68);
  core::AbstractTxInReference::GetVout(in_RCX);
  CreateSignatureHash(in_stack_00000148,in_stack_00000140,in_stack_00000138,in_stack_00000134,
                      in_stack_00000128,in_stack_00000160,in_stack_00000168,in_stack_00000170);
  core::Txid::~Txid((Txid *)0x5609a5);
  return in_RDI;
}

Assistant:

std::string ElementsTransactionApi::CreateSignatureHash(
    const std::string& tx_hex, const ConfidentialTxInReference& txin,
    const ByteData& key_data, const ConfidentialValue& value,
    HashType hash_type, const SigHashType& sighash_type) const {
  return CreateSignatureHash(
      tx_hex, txin.GetTxid(), txin.GetVout(), key_data, value, hash_type,
      sighash_type);
}